

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::quadratic_cost_type<double>::make_l1_norm(quadratic_cost_type<double> *this,int n)

{
  double *pdVar1;
  quad *pqVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if (n == 0) {
    dVar6 = 0.0;
  }
  else {
    dVar6 = 0.0;
    uVar3 = 0;
    auVar7._8_8_ = 0x7fffffffffffffff;
    auVar7._0_8_ = 0x7fffffffffffffff;
    do {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (this->linear_elements)._M_t.
                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl[uVar3];
      auVar9 = vandpd_avx(auVar9,auVar7);
      dVar6 = dVar6 + auVar9._0_8_;
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  uVar3 = (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl[n];
  if (uVar3 != 0) {
    lVar5 = 0;
    auVar8._8_8_ = 0x7fffffffffffffff;
    auVar8._0_8_ = 0x7fffffffffffffff;
    do {
      auVar10._8_8_ = 0;
      auVar10._0_8_ =
           *(ulong *)((long)&((this->quadratic_elements)._M_t.
                              super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                             ._M_head_impl)->factor + lVar5);
      auVar7 = vandpd_avx(auVar10,auVar8);
      dVar6 = dVar6 + auVar7._0_8_;
      lVar5 = lVar5 + 0x10;
    } while (uVar3 << 4 != lVar5);
  }
  if ((uint)((long)ABS(dVar6) + 0xfff0000000000000U >> 0x35) < 0x3ff) {
    if (n != 0) {
      pdVar1 = (this->linear_elements)._M_t.
               super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl;
      uVar4 = 0;
      do {
        pdVar1[uVar4] = pdVar1[uVar4] / dVar6;
        uVar4 = uVar4 + 1;
      } while ((uint)n != uVar4);
    }
    if (uVar3 != 0) {
      pqVar2 = (this->quadratic_elements)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
               .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
               _M_head_impl;
      lVar5 = 0;
      do {
        *(double *)((long)&pqVar2->factor + lVar5) =
             *(double *)((long)&pqVar2->factor + lVar5) / dVar6;
        lVar5 = lVar5 + 0x10;
      } while (uVar3 << 4 != lVar5);
    }
  }
  return;
}

Assistant:

void make_l1_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += std::abs(linear_elements[i]);

        for (int i = 0, e = indices[n]; i != e; ++i)
            div += std::abs(quadratic_elements[i].factor);

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }